

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

size_t __thiscall
spvtools::opt::analysis::ConstantHash::operator()(ConstantHash *this,Constant *const_val)

{
  Type *pTVar1;
  char32_t *pcVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  uint64_t ptr_val;
  char32_t *pcVar9;
  Constant **c;
  u32string h;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_48;
  long *plVar6;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = L'\0';
  pTVar1 = const_val->type_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_48,(char32_t)((ulong)pTVar1 >> 0x20));
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_48,(char32_t)pTVar1);
  iVar5 = (*const_val->_vptr_Constant[0xd])(const_val);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar6 == (long *)0x0) {
    iVar5 = (*const_val->_vptr_Constant[0x11])(const_val);
    plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
    if (plVar6 == (long *)0x0) {
      iVar5 = (*const_val->_vptr_Constant[0x16])(const_val);
      if (CONCAT44(extraout_var_01,iVar5) == 0) {
        __assert_fail("false && \"Tried to compute the hash value of an invalid Constant instance.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                      ,0x1d7,
                      "size_t spvtools::opt::analysis::ConstantHash::operator()(const Constant *) const"
                     );
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_48,L'\0');
    }
    else {
      puVar7 = (undefined8 *)(**(code **)(*plVar6 + 0xc0))(plVar6);
      puVar3 = (undefined8 *)puVar7[1];
      for (puVar7 = (undefined8 *)*puVar7; puVar7 != puVar3; puVar7 = puVar7 + 1) {
        uVar4 = *puVar7;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(&local_48,(char32_t)((ulong)uVar4 >> 0x20));
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(&local_48,(char32_t)uVar4);
      }
    }
  }
  else {
    puVar7 = (undefined8 *)(**(code **)(*plVar6 + 0xc0))(plVar6);
    pcVar2 = (char32_t *)puVar7[1];
    for (pcVar9 = (char32_t *)*puVar7; pcVar9 != pcVar2; pcVar9 = pcVar9 + 1) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_48,*pcVar9);
    }
  }
  sVar8 = std::_Hash_bytes(local_48._M_dataplus._M_p,local_48._M_string_length << 2,0xc70f6907);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return sVar8;
}

Assistant:

size_t operator()(const Constant* const_val) const {
    std::u32string h;
    add_pointer(&h, const_val->type());
    if (const auto scalar = const_val->AsScalarConstant()) {
      for (const auto& w : scalar->words()) {
        h.push_back(w);
      }
    } else if (const auto composite = const_val->AsCompositeConstant()) {
      for (const auto& c : composite->GetComponents()) {
        add_pointer(&h, c);
      }
    } else if (const_val->AsNullConstant()) {
      h.push_back(0);
    } else {
      assert(
          false &&
          "Tried to compute the hash value of an invalid Constant instance.");
    }

    return std::hash<std::u32string>()(h);
  }